

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void swallowed(int first)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  if (first == 0) {
    iVar2 = (int)swallowed::lasty;
    iVar8 = (int)swallowed::lastx;
    for (uVar9 = iVar2 - 1; uVar9 != iVar2 + 2U; uVar9 = uVar9 + 1) {
      iVar3 = 3;
      uVar4 = iVar8 - 1;
      while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
        if ((uVar9 < 0x15) && (uVar4 - 1 < 0x4f)) {
          dbuf[uVar9][uVar4].effect = 0;
        }
        uVar4 = uVar4 + 1;
      }
    }
    dbuf_set(level,iVar8,iVar2,(rm *)0x0,0,0,0,0,0,0,0,0,0,0);
  }
  else {
    memset(dbuf,0,0x9d80);
  }
  iVar2 = monsndx((u.ustuck)->data);
  iVar2 = obfuscate_monster(iVar2);
  iVar8 = (int)u.ux;
  if (iVar8 < 2) {
    if (u.ux < '\0') {
      bVar11 = false;
      bVar7 = false;
      goto LAB_001698ba;
    }
    bVar11 = false;
  }
  else {
    bVar11 = (byte)u.uy < 0x15 && (byte)u.ux < 0x51;
  }
  bVar12 = (byte)u.ux < 0x4f;
  bVar13 = (byte)u.uy < 0x15;
  bVar7 = bVar13 && bVar12;
  if (((byte)(iVar8 - 1U) < 0x4f) && ((byte)(u.uy - 1U) < 0x15)) {
    if (bVar11) {
      iVar5 = (int)u.uy;
      iVar3 = swallow_to_effect(iVar2,0);
      if (iVar5 - 1U < 0x15 && iVar8 - 2U < 0x4f) {
        dbuf[iVar5 - 1U][iVar8 - 1U & 0xff].effect = iVar3;
      }
    }
    uVar9 = (uint)u.ux;
    iVar3 = (int)u.uy;
    iVar8 = swallow_to_effect(iVar2,1);
    if (iVar3 - 1U < 0x15 && uVar9 - 1 < 0x4f) {
      dbuf[iVar3 - 1U][uVar9].effect = iVar8;
    }
    if (bVar13 && bVar12) {
      uVar6 = (ulong)(byte)u.ux;
      iVar3 = (int)u.uy;
      iVar8 = swallow_to_effect(iVar2,2);
      bVar7 = true;
      if (iVar3 - 1U < 0x15 && uVar6 < 0x4f) {
        *(int *)(uVar6 * 0x18 + (ulong)(iVar3 - 1U) * 0x780 + 0x317438) = iVar8;
        bVar7 = true;
      }
    }
    else {
      bVar7 = false;
    }
  }
  if (bVar11) {
    iVar3 = (int)u.ux;
    uVar6 = (ulong)(byte)u.uy;
    iVar8 = swallow_to_effect(iVar2,3);
    bVar11 = true;
    if (iVar3 - 2U < 0x4f && uVar6 < 0x15) {
      dbuf[uVar6][iVar3 - 1].effect = iVar8;
    }
  }
  else {
    bVar11 = false;
  }
LAB_001698ba:
  display_self();
  if (bVar7) {
    uVar6 = (ulong)(byte)u.ux;
    uVar10 = (ulong)(byte)u.uy;
    iVar8 = swallow_to_effect(iVar2,4);
    if (uVar10 < 0x15 && uVar6 < 0x4f) {
      *(int *)(uVar6 * 0x18 + uVar10 * 0x780 + 0x317438) = iVar8;
    }
  }
  bVar1 = u.ux - 1;
  if ((bVar1 < 0x4f) && (iVar8 = (int)u.uy, (byte)(u.uy + 1U) < 0x15)) {
    if (bVar11) {
      iVar3 = swallow_to_effect(iVar2,5);
      if (iVar8 + 1U < 0x15 && bVar1 - 1 < 0x4f) {
        dbuf[iVar8 + 1U][bVar1].effect = iVar3;
      }
    }
    uVar9 = (uint)u.ux;
    iVar3 = (int)u.uy;
    iVar8 = swallow_to_effect(iVar2,6);
    if (iVar3 + 1U < 0x15 && uVar9 - 1 < 0x4f) {
      dbuf[iVar3 + 1U][uVar9].effect = iVar8;
    }
    if (bVar7) {
      uVar6 = (ulong)(byte)u.ux;
      iVar8 = (int)u.uy;
      iVar2 = swallow_to_effect(iVar2,7);
      if (iVar8 + 1U < 0x15 && uVar6 < 0x4f) {
        *(int *)(uVar6 * 0x18 + (ulong)(iVar8 + 1U) * 0x780 + 0x317438) = iVar2;
      }
    }
  }
  swallowed::lastx = u.ux;
  swallowed::lasty = u.uy;
  return;
}

Assistant:

void swallowed(int first)
{
    static xchar lastx, lasty;	/* last swallowed position */
    int swallower, left_ok, rght_ok;

    if (first)
	cls();
    else {
	int x, y;
	/* Clear old location */
	for (y = lasty-1; y <= lasty+1; y++)
	    for (x = lastx-1; x <= lastx+1; x++)
		dbuf_set_effect(x,y,0);
	dbuf_set(level, lastx, lasty, NULL, 0,0,0,0,0,0,0,0,0,0); /* remove hero symbol */
    }

    /* Account for e.g. shuffled dragon appearances. */
    swallower = obfuscate_monster(monsndx(u.ustuck->data));
    /* assume isok(u.ux,u.uy) */
    left_ok = isok(u.ux-1,u.uy);
    rght_ok = isok(u.ux+1,u.uy);
    /*
     *  Display the hero surrounded by the monster's stomach.
     */
    if (isok(u.ux, u.uy-1)) {
	if (left_ok)
	    dbuf_set_effect(u.ux-1, u.uy-1, swallow_to_effect(swallower, S_sw_tl));
	dbuf_set_effect(u.ux, u.uy-1, swallow_to_effect(swallower, S_sw_tc));
	if (rght_ok)
	    dbuf_set_effect(u.ux+1, u.uy-1, swallow_to_effect(swallower, S_sw_tr));
    }

    if (left_ok)
	dbuf_set_effect(u.ux-1, u.uy  , swallow_to_effect(swallower, S_sw_ml));
    display_self();
    if (rght_ok)
	dbuf_set_effect(u.ux+1, u.uy  , swallow_to_effect(swallower, S_sw_mr));

    if (isok(u.ux, u.uy+1)) {
	if (left_ok)
	    dbuf_set_effect(u.ux-1, u.uy+1, swallow_to_effect(swallower, S_sw_bl));
	dbuf_set_effect(u.ux, u.uy+1, swallow_to_effect(swallower, S_sw_bc));
	if (rght_ok)
	    dbuf_set_effect(u.ux+1, u.uy+1, swallow_to_effect(swallower, S_sw_br));
    }

    /* Update the swallowed position. */
    lastx = u.ux;
    lasty = u.uy;
}